

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry_test.cpp
# Opt level: O3

void __thiscall
RegJson_CreateBorderRouterFromBorderAgent_Test::TestBody
          (RegJson_CreateBorderRouterFromBorderAgent_Test *this)

{
  _func_int **pp_Var1;
  size_type sVar2;
  _Alloc_hider _Var3;
  Status SVar4;
  int iVar5;
  undefined8 *puVar6;
  pointer *__ptr;
  pointer pcVar7;
  char *in_R9;
  char *pcVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *expected_predicate_value;
  bool bVar9;
  string local_6b8;
  string local_698;
  string local_678;
  string local_658;
  string dom;
  _Alloc_hider local_600;
  char local_5f0 [24];
  Registry reg;
  string local_5c8;
  string local_5a8;
  string local_588;
  Network nwk;
  ushort local_4f8;
  _Alloc_hider local_4f0;
  size_type local_4e8;
  size_type local_4d0;
  _Alloc_hider local_4c8;
  size_type local_4c0;
  _Alloc_hider local_478;
  size_type local_470;
  BorderRouterId local_3e8;
  State local_3e4;
  BorderRouterId local_3e0;
  State local_3dc;
  BorderRouterId local_3d8;
  State local_3d4;
  BorderRouterId local_3d0;
  State local_3cc;
  BorderRouterId local_3c8;
  State local_3c4;
  BorderRouterId local_3c0;
  State local_3bc;
  BorderRouterId local_3b8;
  State local_3b4;
  BorderAgent ba;
  uint local_230;
  BorderRouter ret_val;
  UnixTime local_a0;
  UnixTime local_98;
  UnixTime local_90;
  UnixTime local_88;
  UnixTime local_80;
  UnixTime local_78;
  UnixTime local_70;
  ByteArray local_68;
  ByteArray local_48;
  
  unlink("./tmp/registry_test.json");
  ret_val._vptr_BorderRouter = (_func_int **)&ret_val.mAgent;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ret_val,"./tmp/registry_test.json","");
  ot::commissioner::persistent_storage::Registry::Registry(&reg,(string *)&ret_val);
  if ((BorderAgent *)ret_val._vptr_BorderRouter != &ret_val.mAgent) {
    operator_delete(ret_val._vptr_BorderRouter);
  }
  SVar4 = ot::commissioner::persistent_storage::Registry::Open(&reg);
  ba._vptr_BorderAgent = (_func_int **)CONCAT71(ba._vptr_BorderAgent._1_7_,SVar4 == kSuccess);
  ba.mAddr._M_dataplus._M_p = (pointer)0x0;
  if (SVar4 != kSuccess) {
    testing::Message::Message((Message *)&nwk);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ret_val,(internal *)&ba,
               (AssertionResult *)"reg.Open() == Registry::Status::kSuccess","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&dom,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x41,(char *)ret_val._vptr_BorderRouter);
    testing::internal::AssertHelper::operator=((AssertHelper *)&dom,(Message *)&nwk);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&dom);
    if ((BorderAgent *)ret_val._vptr_BorderRouter != &ret_val.mAgent) {
      operator_delete(ret_val._vptr_BorderRouter);
    }
    if (nwk._0_8_ != 0) {
      (**(code **)(*(long *)nwk._0_8_ + 8))();
    }
    _Var3._M_p = ba.mAddr._M_dataplus._M_p;
    if (ba.mAddr._M_dataplus._M_p != (pointer)0x0) {
      if (*ba.mAddr._M_dataplus._M_p != ba.mAddr._M_dataplus._M_p + 0x10) {
        operator_delete(*ba.mAddr._M_dataplus._M_p);
      }
      operator_delete(_Var3._M_p);
    }
  }
  ret_val._vptr_BorderRouter = (_func_int **)&ret_val.mAgent;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ret_val,"1.1.1.1","");
  local_5a8._M_dataplus._M_p = (pointer)0x0;
  local_5a8._M_string_length = 0;
  local_5a8.field_2._M_allocated_capacity = 0;
  nwk._0_8_ = &nwk.mName._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&nwk);
  ot::commissioner::BorderAgent::State::State(&local_3b4,0);
  dom._M_dataplus._M_p = (pointer)&dom.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&dom,"net1","");
  local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b8,anon_var_dwarf_66ec33 + 9);
  local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,anon_var_dwarf_66ec33 + 9);
  local_678._M_dataplus._M_p = (pointer)&local_678.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_678,anon_var_dwarf_66ec33 + 9);
  local_588._M_dataplus._M_p = (pointer)0x0;
  local_588._M_string_length = 0;
  local_588.field_2._M_allocated_capacity = 0;
  local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_658,anon_var_dwarf_66ec33 + 9);
  local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8);
  ot::commissioner::UnixTime::UnixTime(&local_70,0);
  pcVar8 = (char *)(ulong)(uint)local_3b4;
  ot::commissioner::BorderAgent::BorderAgent
            (&ba,(string *)&ret_val,1,(ByteArray *)&local_5a8,(string *)&nwk,local_3b4,&dom,
             0x101010101010101,&local_6b8,&local_698,(Timestamp)0x0,0,&local_678,
             (ByteArray *)&local_588,&local_658,'\0',0,&local_5c8,local_70,0x33);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
    operator_delete(local_5c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658._M_dataplus._M_p != &local_658.field_2) {
    operator_delete(local_658._M_dataplus._M_p);
  }
  if (local_588._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_588._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678._M_dataplus._M_p != &local_678.field_2) {
    operator_delete(local_678._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698._M_dataplus._M_p != &local_698.field_2) {
    operator_delete(local_698._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
    operator_delete(local_6b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dom._M_dataplus._M_p != &dom.field_2) {
    operator_delete(dom._M_dataplus._M_p);
  }
  if ((size_type *)nwk._0_8_ != &nwk.mName._M_string_length) {
    operator_delete((void *)nwk._0_8_);
  }
  if (local_5a8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_5a8._M_dataplus._M_p);
  }
  if ((BorderAgent *)ret_val._vptr_BorderRouter != &ret_val.mAgent) {
    operator_delete(ret_val._vptr_BorderRouter);
  }
  SVar4 = ot::commissioner::persistent_storage::Registry::Add(&reg,&ba);
  nwk.mId.mId._0_1_ = SVar4 == kSuccess;
  nwk.mName._M_dataplus._M_p = (pointer)0x0;
  if (SVar4 != kSuccess) {
    testing::Message::Message((Message *)&dom);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ret_val,(internal *)&nwk,
               (AssertionResult *)"reg.Add(ba) == Registry::Status::kSuccess","false","true",pcVar8)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_6b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x59,(char *)ret_val._vptr_BorderRouter);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_6b8,(Message *)&dom);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_6b8);
    if ((BorderAgent *)ret_val._vptr_BorderRouter != &ret_val.mAgent) {
      operator_delete(ret_val._vptr_BorderRouter);
    }
    if (dom._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)dom._M_dataplus._M_p + 8))();
    }
    _Var3._M_p = nwk.mName._M_dataplus._M_p;
    if (nwk.mName._M_dataplus._M_p != (pointer)0x0) {
      if (*nwk.mName._M_dataplus._M_p != nwk.mName._M_dataplus._M_p + 0x10) {
        operator_delete(*nwk.mName._M_dataplus._M_p);
      }
      operator_delete(_Var3._M_p);
    }
  }
  ot::commissioner::persistent_storage::BorderRouter::BorderRouter(&ret_val);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_3b8,0);
  SVar4 = ot::commissioner::persistent_storage::Registry::GetBorderRouter(&reg,local_3b8,&ret_val);
  dom._M_dataplus._M_p._0_1_ = SVar4 == kSuccess;
  dom._M_string_length = 0;
  if (SVar4 != kSuccess) {
    testing::Message::Message((Message *)&local_6b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&nwk,(internal *)&dom,
               (AssertionResult *)
               "reg.GetBorderRouter(BorderRouterId{0}, ret_val) == Registry::Status::kSuccess",
               "false","true",pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_698,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x5b,(char *)nwk._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_698,(Message *)&local_6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_698);
    if ((size_type *)nwk._0_8_ != &nwk.mName._M_string_length) {
      operator_delete((void *)nwk._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_6b8._M_dataplus._M_p + 8))();
    }
    sVar2 = dom._M_string_length;
    if (dom._M_string_length != 0) {
      if (*(void **)dom._M_string_length != (void *)(dom._M_string_length + 0x10)) {
        operator_delete(*(void **)dom._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
  }
  dom._M_dataplus._M_p._0_1_ = ret_val.mNetworkId.mId == 0;
  dom._M_string_length = 0;
  if (ret_val.mNetworkId.mId != 0) {
    testing::Message::Message((Message *)&local_6b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&nwk,(internal *)&dom,(AssertionResult *)"ret_val.mNetworkId.mId == 0",
               "false","true",pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_698,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x5c,(char *)nwk._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_698,(Message *)&local_6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_698);
    if ((size_type *)nwk._0_8_ != &nwk.mName._M_string_length) {
      operator_delete((void *)nwk._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_6b8._M_dataplus._M_p + 8))();
    }
    sVar2 = dom._M_string_length;
    if (dom._M_string_length != 0) {
      if (*(void **)dom._M_string_length != (void *)(dom._M_string_length + 0x10)) {
        operator_delete(*(void **)dom._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
  }
  ot::commissioner::persistent_storage::Network::Network(&nwk);
  SVar4 = ot::commissioner::persistent_storage::Registry::GetNetworkByXpan(&reg,0,&nwk);
  local_6b8._M_string_length = 0;
  if (SVar4 != kSuccess) {
    local_6b8._M_dataplus._M_p._0_1_ = SVar4 == kSuccess;
    testing::Message::Message((Message *)&local_698);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&dom,(internal *)&local_6b8,
               (AssertionResult *)"reg.GetNetworkByXpan(0, nwk) == Registry::Status::kSuccess",
               "false","true",pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_678,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x5e,dom._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_678,(Message *)&local_698);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_678);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dom._M_dataplus._M_p != &dom.field_2) {
      operator_delete(dom._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_698._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_698._M_dataplus._M_p + 8))();
    }
    sVar2 = local_6b8._M_string_length;
    if ((undefined8 *)local_6b8._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_6b8._M_string_length !=
          (undefined8 *)(local_6b8._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_6b8._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
  }
  local_6b8._M_dataplus._M_p._0_1_ = nwk.mDomainId.mId == 0xffffffff;
  local_6b8._M_string_length = 0;
  if (nwk.mDomainId.mId != 0xffffffff) {
    testing::Message::Message((Message *)&local_698);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&dom,(internal *)&local_6b8,(AssertionResult *)"nwk.mDomainId.mId == EMPTY_ID",
               "false","true",pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_678,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x5f,dom._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_678,(Message *)&local_698);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_678);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dom._M_dataplus._M_p != &dom.field_2) {
      operator_delete(dom._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_698._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_698._M_dataplus._M_p + 8))();
    }
    sVar2 = local_6b8._M_string_length;
    if ((undefined8 *)local_6b8._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_6b8._M_string_length !=
          (undefined8 *)(local_6b8._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_6b8._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)nwk.mMlp._M_dataplus._M_p != &nwk.mMlp.field_2) {
    operator_delete(nwk.mMlp._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)nwk.mName._M_dataplus._M_p != &nwk.mName.field_2) {
    operator_delete(nwk.mName._M_dataplus._M_p);
  }
  ret_val._vptr_BorderRouter = (_func_int **)&PTR__BorderRouter_002b2218;
  ot::commissioner::BorderAgent::~BorderAgent(&ret_val.mAgent);
  ot::commissioner::BorderAgent::~BorderAgent(&ba);
  ret_val._vptr_BorderRouter = (_func_int **)&ret_val.mAgent;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ret_val,"1.1.1.2","");
  local_5a8._M_dataplus._M_p = (pointer)0x0;
  local_5a8._M_string_length = 0;
  local_5a8.field_2._M_allocated_capacity = 0;
  nwk._0_8_ = &nwk.mName._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>();
  ot::commissioner::BorderAgent::State::State(&local_3bc,0);
  dom._M_dataplus._M_p = (pointer)&dom.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&dom,"net2","");
  local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b8,anon_var_dwarf_66ec33 + 9);
  local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,anon_var_dwarf_66ec33 + 9);
  local_678._M_dataplus._M_p = (pointer)&local_678.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_678,anon_var_dwarf_66ec33 + 9);
  local_588._M_dataplus._M_p = (pointer)0x0;
  local_588._M_string_length = 0;
  local_588.field_2._M_allocated_capacity = 0;
  local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_658,"dom2","");
  local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8);
  ot::commissioner::UnixTime::UnixTime(&local_78,0);
  pcVar8 = (char *)(ulong)(uint)local_3bc;
  ot::commissioner::BorderAgent::BorderAgent
            (&ba,(string *)&ret_val,2,(ByteArray *)&local_5a8,(string *)&nwk,local_3bc,&dom,
             0x202020202020202,&local_6b8,&local_698,(Timestamp)0x0,0,&local_678,
             (ByteArray *)&local_588,&local_658,'\0',0,&local_5c8,local_78,0x1033);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
    operator_delete(local_5c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658._M_dataplus._M_p != &local_658.field_2) {
    operator_delete(local_658._M_dataplus._M_p);
  }
  if (local_588._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_588._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678._M_dataplus._M_p != &local_678.field_2) {
    operator_delete(local_678._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698._M_dataplus._M_p != &local_698.field_2) {
    operator_delete(local_698._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
    operator_delete(local_6b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dom._M_dataplus._M_p != &dom.field_2) {
    operator_delete(dom._M_dataplus._M_p);
  }
  if ((size_type *)nwk._0_8_ != &nwk.mName._M_string_length) {
    operator_delete((void *)nwk._0_8_);
  }
  if (local_5a8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_5a8._M_dataplus._M_p);
  }
  if ((BorderAgent *)ret_val._vptr_BorderRouter != &ret_val.mAgent) {
    operator_delete(ret_val._vptr_BorderRouter);
  }
  SVar4 = ot::commissioner::persistent_storage::Registry::Add(&reg,&ba);
  nwk.mId.mId._0_1_ = SVar4 == kSuccess;
  nwk.mName._M_dataplus._M_p = (pointer)0x0;
  if (SVar4 != kSuccess) {
    testing::Message::Message((Message *)&dom);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ret_val,(internal *)&nwk,
               (AssertionResult *)"reg.Add(ba) == Registry::Status::kSuccess","false","true",pcVar8)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_6b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x78,(char *)ret_val._vptr_BorderRouter);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_6b8,(Message *)&dom);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_6b8);
    if ((BorderAgent *)ret_val._vptr_BorderRouter != &ret_val.mAgent) {
      operator_delete(ret_val._vptr_BorderRouter);
    }
    if (dom._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)dom._M_dataplus._M_p + 8))();
    }
    _Var3._M_p = nwk.mName._M_dataplus._M_p;
    if (nwk.mName._M_dataplus._M_p != (pointer)0x0) {
      if (*nwk.mName._M_dataplus._M_p != nwk.mName._M_dataplus._M_p + 0x10) {
        operator_delete(*nwk.mName._M_dataplus._M_p);
      }
      operator_delete(_Var3._M_p);
    }
  }
  ot::commissioner::persistent_storage::BorderRouter::BorderRouter(&ret_val);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_3c0,1);
  SVar4 = ot::commissioner::persistent_storage::Registry::GetBorderRouter(&reg,local_3c0,&ret_val);
  dom._M_dataplus._M_p._0_1_ = SVar4 == kSuccess;
  dom._M_string_length = 0;
  if (SVar4 != kSuccess) {
    testing::Message::Message((Message *)&local_6b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&nwk,(internal *)&dom,
               (AssertionResult *)
               "reg.GetBorderRouter(BorderRouterId{1}, ret_val) == Registry::Status::kSuccess",
               "false","true",pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_698,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x7b,(char *)nwk._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_698,(Message *)&local_6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_698);
    if ((size_type *)nwk._0_8_ != &nwk.mName._M_string_length) {
      operator_delete((void *)nwk._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_6b8._M_dataplus._M_p + 8))();
    }
    sVar2 = dom._M_string_length;
    if (dom._M_string_length != 0) {
      if (*(void **)dom._M_string_length != (void *)(dom._M_string_length + 0x10)) {
        operator_delete(*(void **)dom._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
  }
  dom._M_dataplus._M_p._0_1_ = ret_val.mNetworkId.mId == 1;
  dom._M_string_length = 0;
  if (ret_val.mNetworkId.mId != 1) {
    testing::Message::Message((Message *)&local_6b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&nwk,(internal *)&dom,(AssertionResult *)"ret_val.mNetworkId.mId == 1",
               "false","true",pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_698,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x7c,(char *)nwk._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_698,(Message *)&local_6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_698);
    if ((size_type *)nwk._0_8_ != &nwk.mName._M_string_length) {
      operator_delete((void *)nwk._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_6b8._M_dataplus._M_p + 8))();
    }
    sVar2 = dom._M_string_length;
    if (dom._M_string_length != 0) {
      if (*(void **)dom._M_string_length != (void *)(dom._M_string_length + 0x10)) {
        operator_delete(*(void **)dom._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
  }
  ot::commissioner::persistent_storage::Network::Network(&nwk);
  SVar4 = ot::commissioner::persistent_storage::Registry::GetNetworkByName
                    (&reg,&ba.mNetworkName,&nwk);
  local_6b8._M_string_length = 0;
  if (SVar4 != kSuccess) {
    local_6b8._M_dataplus._M_p._0_1_ = SVar4 == kSuccess;
    testing::Message::Message((Message *)&local_698);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&dom,(internal *)&local_6b8,
               (AssertionResult *)
               "reg.GetNetworkByName(ba.mNetworkName, nwk) == Registry::Status::kSuccess","false",
               "true",pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_678,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x7e,dom._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_678,(Message *)&local_698);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_678);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dom._M_dataplus._M_p != &dom.field_2) {
      operator_delete(dom._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_698._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_698._M_dataplus._M_p + 8))();
    }
    sVar2 = local_6b8._M_string_length;
    if ((undefined8 *)local_6b8._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_6b8._M_string_length !=
          (undefined8 *)(local_6b8._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_6b8._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
  }
  local_6b8._M_dataplus._M_p._0_1_ = nwk.mId.mId == 1;
  local_6b8._M_string_length = 0;
  if (!(bool)local_6b8._M_dataplus._M_p._0_1_) {
    testing::Message::Message((Message *)&local_698);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&dom,(internal *)&local_6b8,(AssertionResult *)"nwk.mId.mId == 1","false","true",
               pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_678,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x7f,dom._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_678,(Message *)&local_698);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_678);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dom._M_dataplus._M_p != &dom.field_2) {
      operator_delete(dom._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_698._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_698._M_dataplus._M_p + 8))();
    }
    sVar2 = local_6b8._M_string_length;
    if ((undefined8 *)local_6b8._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_6b8._M_string_length !=
          (undefined8 *)(local_6b8._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_6b8._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
  }
  local_6b8._M_dataplus._M_p._0_1_ = nwk.mDomainId.mId == 0;
  local_6b8._M_string_length = 0;
  if (nwk.mDomainId.mId != 0) {
    testing::Message::Message((Message *)&local_698);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&dom,(internal *)&local_6b8,(AssertionResult *)"nwk.mDomainId.mId == 0","false",
               "true",pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_678,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x80,dom._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_678,(Message *)&local_698);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_678);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dom._M_dataplus._M_p != &dom.field_2) {
      operator_delete(dom._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_698._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_698._M_dataplus._M_p + 8))();
    }
    sVar2 = local_6b8._M_string_length;
    if ((undefined8 *)local_6b8._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_6b8._M_string_length !=
          (undefined8 *)(local_6b8._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_6b8._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
  }
  dom._M_dataplus._M_p = (pointer)&dom.field_2;
  dom._M_string_length = 0;
  dom.field_2._M_local_buf[0] = '\0';
  SVar4 = ot::commissioner::persistent_storage::Registry::GetDomainNameByXpan(&reg,nwk.mXpan,&dom);
  bVar9 = SVar4 == kSuccess;
  local_698._M_string_length = 0;
  local_698._M_dataplus._M_p._0_1_ = bVar9;
  if (!bVar9) {
    testing::Message::Message((Message *)&local_678);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_6b8,(internal *)&local_698,
               (AssertionResult *)
               "reg.GetDomainNameByXpan(nwk.mXpan, dom) == Registry::Status::kSuccess","false",
               "true",pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x82,local_6b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_658,(Message *)&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_658);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
      operator_delete(local_6b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_678._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_678._M_dataplus._M_p + 8))();
    }
    sVar2 = local_698._M_string_length;
    if ((undefined8 *)local_698._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_698._M_string_length !=
          (undefined8 *)(local_698._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_698._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
  }
  if (dom._M_string_length == ba.mDomainName._M_string_length) {
    if (dom._M_string_length != 0) {
      iVar5 = bcmp(dom._M_dataplus._M_p,ba.mDomainName._M_dataplus._M_p,dom._M_string_length);
      local_698._M_dataplus._M_p._0_1_ = iVar5 == 0;
      local_698._M_string_length = 0;
      if (!(bool)(byte)local_698._M_dataplus._M_p) goto LAB_00159b26;
    }
  }
  else {
    local_698._M_dataplus._M_p._0_1_ = false;
LAB_00159b26:
    local_698._M_string_length = 0;
    testing::Message::Message((Message *)&local_678);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_6b8,(internal *)&local_698,(AssertionResult *)"dom == ba.mDomainName","false",
               "true",pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x83,local_6b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_658,(Message *)&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_658);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
      operator_delete(local_6b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_678._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_678._M_dataplus._M_p + 8))();
    }
    sVar2 = local_698._M_string_length;
    if ((undefined8 *)local_698._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_698._M_string_length !=
          (undefined8 *)(local_698._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_698._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dom._M_dataplus._M_p != &dom.field_2) {
    operator_delete(dom._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)nwk.mMlp._M_dataplus._M_p != &nwk.mMlp.field_2) {
    operator_delete(nwk.mMlp._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)nwk.mName._M_dataplus._M_p != &nwk.mName.field_2) {
    operator_delete(nwk.mName._M_dataplus._M_p);
  }
  ret_val._vptr_BorderRouter = (_func_int **)&PTR__BorderRouter_002b2218;
  ot::commissioner::BorderAgent::~BorderAgent(&ret_val.mAgent);
  ot::commissioner::BorderAgent::~BorderAgent(&ba);
  ba._vptr_BorderAgent = (_func_int **)&ba.mAddr._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ba,"1.1.1.1","");
  local_5a8._M_dataplus._M_p = (pointer)0x0;
  local_5a8._M_string_length = 0;
  local_5a8.field_2._M_allocated_capacity = 0;
  nwk._0_8_ = &nwk.mName._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>();
  ot::commissioner::BorderAgent::State::State(&local_3c4,0);
  dom._M_dataplus._M_p = (pointer)&dom.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&dom,anon_var_dwarf_66ec33 + 9);
  local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b8,"vendorName","");
  local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,anon_var_dwarf_66ec33 + 9);
  local_678._M_dataplus._M_p = (pointer)&local_678.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_678,anon_var_dwarf_66ec33 + 9);
  local_588._M_dataplus._M_p = (pointer)0x0;
  local_588._M_string_length = 0;
  local_588.field_2._M_allocated_capacity = 0;
  local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_658,anon_var_dwarf_66ec33 + 9);
  local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8);
  ot::commissioner::UnixTime::UnixTime(&local_80,0);
  expected_predicate_value =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(ulong)(uint)local_3c4;
  ot::commissioner::BorderAgent::BorderAgent
            ((BorderAgent *)&ret_val,(string *)&ba,1,(ByteArray *)&local_5a8,(string *)&nwk,
             local_3c4,&dom,0,&local_6b8,&local_698,(Timestamp)0x0,0,&local_678,
             (ByteArray *)&local_588,&local_658,'\0',0,&local_5c8,local_80,0x43);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
    operator_delete(local_5c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658._M_dataplus._M_p != &local_658.field_2) {
    operator_delete(local_658._M_dataplus._M_p);
  }
  if (local_588._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_588._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678._M_dataplus._M_p != &local_678.field_2) {
    operator_delete(local_678._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698._M_dataplus._M_p != &local_698.field_2) {
    operator_delete(local_698._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
    operator_delete(local_6b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dom._M_dataplus._M_p != &dom.field_2) {
    operator_delete(dom._M_dataplus._M_p);
  }
  if ((size_type *)nwk._0_8_ != &nwk.mName._M_string_length) {
    operator_delete((void *)nwk._0_8_);
  }
  if (local_5a8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_5a8._M_dataplus._M_p);
  }
  if (ba._vptr_BorderAgent != (_func_int **)&ba.mAddr._M_string_length) {
    operator_delete(ba._vptr_BorderAgent);
  }
  SVar4 = ot::commissioner::persistent_storage::Registry::Add(&reg,(BorderAgent *)&ret_val);
  bVar9 = SVar4 == kError;
  nwk.mName._M_dataplus._M_p = (pointer)0x0;
  nwk.mId.mId._0_1_ = bVar9;
  if (!bVar9) {
    testing::Message::Message((Message *)&dom);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ba,(internal *)&nwk,
               (AssertionResult *)"reg.Add(ba) == Registry::Status::kError","false","true",
               expected_predicate_value->_M_local_buf);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_6b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x9c,(char *)ba._vptr_BorderAgent);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_6b8,(Message *)&dom);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_6b8);
    if (ba._vptr_BorderAgent != (_func_int **)&ba.mAddr._M_string_length) {
      operator_delete(ba._vptr_BorderAgent);
    }
    if (dom._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)dom._M_dataplus._M_p + 8))();
    }
    _Var3._M_p = nwk.mName._M_dataplus._M_p;
    if (nwk.mName._M_dataplus._M_p != (pointer)0x0) {
      if (*nwk.mName._M_dataplus._M_p != nwk.mName._M_dataplus._M_p + 0x10) {
        operator_delete(*nwk.mName._M_dataplus._M_p);
      }
      operator_delete(_Var3._M_p);
    }
  }
  ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&ret_val);
  ot::commissioner::persistent_storage::BorderRouter::BorderRouter(&ret_val);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_3c8,0);
  SVar4 = ot::commissioner::persistent_storage::Registry::GetBorderRouter(&reg,local_3c8,&ret_val);
  nwk.mId.mId._0_1_ = SVar4 == kSuccess;
  nwk.mName._M_dataplus._M_p = (pointer)0x0;
  if (!(bool)(undefined1)nwk.mId.mId) {
    testing::Message::Message((Message *)&dom);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ba,(internal *)&nwk,
               (AssertionResult *)
               "reg.GetBorderRouter(BorderRouterId{0}, val) == Registry::Status::kSuccess","false",
               "true",expected_predicate_value->_M_local_buf);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_6b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xa2,(char *)ba._vptr_BorderAgent);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_6b8,(Message *)&dom);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_6b8);
    if (ba._vptr_BorderAgent != (_func_int **)&ba.mAddr._M_string_length) {
      operator_delete(ba._vptr_BorderAgent);
    }
    if (dom._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)dom._M_dataplus._M_p + 8))();
    }
    _Var3._M_p = nwk.mName._M_dataplus._M_p;
    if (nwk.mName._M_dataplus._M_p != (pointer)0x0) {
      if (*nwk.mName._M_dataplus._M_p != nwk.mName._M_dataplus._M_p + 0x10) {
        operator_delete(*nwk.mName._M_dataplus._M_p);
      }
      operator_delete(_Var3._M_p);
    }
  }
  nwk.mId.mId._0_1_ = (~ret_val.mAgent.mPresentFlags & 3) == 0;
  nwk.mName._M_dataplus._M_p = (pointer)0x0;
  if (!(bool)(undefined1)nwk.mId.mId) {
    testing::Message::Message((Message *)&dom);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ba,(internal *)&nwk,
               (AssertionResult *)
               "(val.mAgent.mPresentFlags & (BorderAgent::kAddrBit | BorderAgent::kPortBit)) == (BorderAgent::kAddrBit | BorderAgent::kPortBit)"
               ,"false","true",expected_predicate_value->_M_local_buf);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_6b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xa4,(char *)ba._vptr_BorderAgent);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_6b8,(Message *)&dom);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_6b8);
    if (ba._vptr_BorderAgent != (_func_int **)&ba.mAddr._M_string_length) {
      operator_delete(ba._vptr_BorderAgent);
    }
    if (dom._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)dom._M_dataplus._M_p + 8))();
    }
    _Var3._M_p = nwk.mName._M_dataplus._M_p;
    if (nwk.mName._M_dataplus._M_p != (pointer)0x0) {
      if (*nwk.mName._M_dataplus._M_p != nwk.mName._M_dataplus._M_p + 0x10) {
        operator_delete(*nwk.mName._M_dataplus._M_p);
      }
      operator_delete(_Var3._M_p);
    }
  }
  iVar5 = std::__cxx11::string::compare((char *)&ret_val.mAgent.mAddr);
  nwk.mId.mId._0_1_ = iVar5 == 0;
  nwk.mName._M_dataplus._M_p = (pointer)0x0;
  if (iVar5 != 0) {
    testing::Message::Message((Message *)&dom);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ba,(internal *)&nwk,(AssertionResult *)"val.mAgent.mAddr == \"1.1.1.1\"",
               "false","true",expected_predicate_value->_M_local_buf);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_6b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xa5,(char *)ba._vptr_BorderAgent);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_6b8,(Message *)&dom);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_6b8);
    if (ba._vptr_BorderAgent != (_func_int **)&ba.mAddr._M_string_length) {
      operator_delete(ba._vptr_BorderAgent);
    }
    if (dom._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)dom._M_dataplus._M_p + 8))();
    }
    _Var3._M_p = nwk.mName._M_dataplus._M_p;
    if (nwk.mName._M_dataplus._M_p != (pointer)0x0) {
      if (*nwk.mName._M_dataplus._M_p != nwk.mName._M_dataplus._M_p + 0x10) {
        operator_delete(*nwk.mName._M_dataplus._M_p);
      }
      operator_delete(_Var3._M_p);
    }
  }
  nwk._0_8_ = &nwk.mName._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&nwk,ret_val.mAgent.mNetworkName._M_dataplus._M_p,
             ret_val.mAgent.mNetworkName._M_dataplus._M_p +
             ret_val.mAgent.mNetworkName._M_string_length);
  std::__cxx11::string::append((char *)&nwk);
  ot::commissioner::utils::Hex<unsigned_long>(&dom,ret_val.mAgent.mExtendedPanId);
  pcVar7 = (pointer)0xf;
  if ((size_type *)nwk._0_8_ != &nwk.mName._M_string_length) {
    pcVar7 = (pointer)nwk.mName._M_string_length;
  }
  if (pcVar7 < nwk.mName._M_dataplus._M_p + dom._M_string_length) {
    pcVar7 = (pointer)0xf;
    expected_predicate_value = &dom.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dom._M_dataplus._M_p != expected_predicate_value) {
      pcVar7 = (pointer)CONCAT71(dom.field_2._M_allocated_capacity._1_7_,dom.field_2._M_local_buf[0]
                                );
    }
    if (pcVar7 < nwk.mName._M_dataplus._M_p + dom._M_string_length) goto LAB_0015a385;
    puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)&dom,0,(char *)0x0,nwk._0_8_);
  }
  else {
LAB_0015a385:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&nwk,(ulong)dom._M_dataplus._M_p)
    ;
  }
  ba._vptr_BorderAgent = (_func_int **)&ba.mAddr._M_string_length;
  pp_Var1 = (_func_int **)(puVar6 + 2);
  if ((_func_int **)*puVar6 == pp_Var1) {
    ba.mAddr._M_string_length = (size_type)*pp_Var1;
    ba.mAddr.field_2._M_allocated_capacity = puVar6[3];
  }
  else {
    ba.mAddr._M_string_length = (size_type)*pp_Var1;
    ba._vptr_BorderAgent = (_func_int **)*puVar6;
  }
  ba.mAddr._M_dataplus._M_p = (pointer)puVar6[1];
  *puVar6 = pp_Var1;
  puVar6[1] = 0;
  *(undefined1 *)pp_Var1 = 0;
  ot::commissioner::Console::Write((string *)&ba,kDefault);
  if (ba._vptr_BorderAgent != (_func_int **)&ba.mAddr._M_string_length) {
    operator_delete(ba._vptr_BorderAgent);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dom._M_dataplus._M_p != &dom.field_2) {
    operator_delete(dom._M_dataplus._M_p);
  }
  if ((size_type *)nwk._0_8_ != &nwk.mName._M_string_length) {
    operator_delete((void *)nwk._0_8_);
  }
  ot::commissioner::persistent_storage::Network::Network((Network *)&dom);
  SVar4 = ot::commissioner::persistent_storage::Registry::GetNetworkByXpan
                    (&reg,ret_val.mAgent.mExtendedPanId,(Network *)&dom);
  nwk.mId.mId._0_1_ = SVar4 == kSuccess;
  nwk.mName._M_dataplus._M_p = (pointer)0x0;
  if (SVar4 != kSuccess) {
    testing::Message::Message((Message *)&local_6b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ba,(internal *)&nwk,
               (AssertionResult *)
               "reg.GetNetworkByXpan(val.mAgent.mExtendedPanId, nwk) == Registry::Status::kSuccess",
               "false","true",expected_predicate_value->_M_local_buf);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_698,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xa8,(char *)ba._vptr_BorderAgent);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_698,(Message *)&local_6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_698);
    if (ba._vptr_BorderAgent != (_func_int **)&ba.mAddr._M_string_length) {
      operator_delete(ba._vptr_BorderAgent);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_6b8._M_dataplus._M_p + 8))();
    }
    _Var3._M_p = nwk.mName._M_dataplus._M_p;
    if (nwk.mName._M_dataplus._M_p != (pointer)0x0) {
      if (*nwk.mName._M_dataplus._M_p != nwk.mName._M_dataplus._M_p + 0x10) {
        operator_delete(*nwk.mName._M_dataplus._M_p);
      }
      operator_delete(_Var3._M_p);
    }
  }
  ba._vptr_BorderAgent = (_func_int **)&ba.mAddr._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ba,"1.1.1.1","");
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b8,anon_var_dwarf_66ec33 + 9);
  ot::commissioner::BorderAgent::State::State(&local_3cc,3,2,1,0,0);
  local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,"net1","");
  local_678._M_dataplus._M_p = (pointer)&local_678.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_678,"vendorName","");
  local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_658,anon_var_dwarf_66ec33 + 9);
  local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8,"vendorData","");
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,anon_var_dwarf_66ec33 + 9);
  local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_588);
  ot::commissioner::UnixTime::UnixTime(&local_88,0);
  pcVar8 = (char *)(ulong)(uint)local_3cc;
  ot::commissioner::BorderAgent::BorderAgent
            ((BorderAgent *)&nwk,(string *)&ba,1,&local_48,&local_6b8,local_3cc,&local_698,
             0x101010101010101,&local_678,&local_658,(Timestamp)0x0,0,&local_5c8,&local_68,
             &local_5a8,'\0',0,&local_588,local_88,0x47b);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != &local_588.field_2) {
    operator_delete(local_588._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
    operator_delete(local_5a8._M_dataplus._M_p);
  }
  if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
    operator_delete(local_5c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658._M_dataplus._M_p != &local_658.field_2) {
    operator_delete(local_658._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678._M_dataplus._M_p != &local_678.field_2) {
    operator_delete(local_678._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698._M_dataplus._M_p != &local_698.field_2) {
    operator_delete(local_698._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
    operator_delete(local_6b8._M_dataplus._M_p);
  }
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (ba._vptr_BorderAgent != (_func_int **)&ba.mAddr._M_string_length) {
    operator_delete(ba._vptr_BorderAgent);
  }
  SVar4 = ot::commissioner::persistent_storage::Registry::Add(&reg,(BorderAgent *)&nwk);
  local_6b8._M_dataplus._M_p._0_1_ = SVar4 == kSuccess;
  local_6b8._M_string_length = 0;
  if (SVar4 != kSuccess) {
    testing::Message::Message((Message *)&local_698);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ba,(internal *)&local_6b8,
               (AssertionResult *)"reg.Add(ba) == Registry::Status::kSuccess","false","true",pcVar8)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_678,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xc1,(char *)ba._vptr_BorderAgent);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_678,(Message *)&local_698);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_678);
    if (ba._vptr_BorderAgent != (_func_int **)&ba.mAddr._M_string_length) {
      operator_delete(ba._vptr_BorderAgent);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_698._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_698._M_dataplus._M_p + 8))();
    }
    sVar2 = local_6b8._M_string_length;
    if ((undefined8 *)local_6b8._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_6b8._M_string_length !=
          (undefined8 *)(local_6b8._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_6b8._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
  }
  ot::commissioner::persistent_storage::BorderRouter::BorderRouter((BorderRouter *)&ba);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_3d0,0);
  SVar4 = ot::commissioner::persistent_storage::Registry::GetBorderRouter
                    (&reg,local_3d0,(BorderRouter *)&ba);
  local_698._M_string_length = 0;
  if (SVar4 != kSuccess) {
    local_698._M_dataplus._M_p._0_1_ = SVar4 == kSuccess;
    testing::Message::Message((Message *)&local_678);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_6b8,(internal *)&local_698,
               (AssertionResult *)
               "reg.GetBorderRouter(BorderRouterId{0}, new_val) == Registry::Status::kSuccess",
               "false","true",pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xc3,local_6b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_658,(Message *)&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_658);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
      operator_delete(local_6b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_678._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_678._M_dataplus._M_p + 8))();
    }
    sVar2 = local_698._M_string_length;
    if ((undefined8 *)local_698._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_698._M_string_length !=
          (undefined8 *)(local_698._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_698._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
  }
  local_698._M_dataplus._M_p._0_1_ = ret_val.mId.mId == (uint)ba.mAddr._M_dataplus._M_p;
  local_698._M_string_length = 0;
  if (!(bool)(byte)local_698._M_dataplus._M_p) {
    testing::Message::Message((Message *)&local_678);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_6b8,(internal *)&local_698,(AssertionResult *)"val.mId.mId == new_val.mId.mId"
               ,"false","true",pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xc4,local_6b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_658,(Message *)&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_658);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
      operator_delete(local_6b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_678._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_678._M_dataplus._M_p + 8))();
    }
    sVar2 = local_698._M_string_length;
    if ((undefined8 *)local_698._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_698._M_string_length !=
          (undefined8 *)(local_698._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_698._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
  }
  local_698._M_dataplus._M_p._0_1_ = ret_val.mNetworkId.mId == ba.mAddr._M_dataplus._M_p._4_4_;
  local_698._M_string_length = 0;
  if (!(bool)(byte)local_698._M_dataplus._M_p) {
    testing::Message::Message((Message *)&local_678);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_6b8,(internal *)&local_698,
               (AssertionResult *)"val.mNetworkId.mId == new_val.mNetworkId.mId","false","true",
               pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xc5,local_6b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_658,(Message *)&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_658);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
      operator_delete(local_6b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_678._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_678._M_dataplus._M_p + 8))();
    }
    sVar2 = local_698._M_string_length;
    if ((undefined8 *)local_698._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_698._M_string_length !=
          (undefined8 *)(local_698._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_698._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
  }
  local_698._M_dataplus._M_p._0_1_ = (byte)local_230 >> 3 & 1;
  local_698._M_string_length = 0;
  if ((byte)local_698._M_dataplus._M_p == 0) {
    testing::Message::Message((Message *)&local_678);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_6b8,(internal *)&local_698,
               (AssertionResult *)"(new_val.mAgent.mPresentFlags & BorderAgent::kStateBit) != 0",
               "false","true",pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xc6,local_6b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_658,(Message *)&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_658);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
      operator_delete(local_6b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_678._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_678._M_dataplus._M_p + 8))();
    }
    sVar2 = local_698._M_string_length;
    if ((undefined8 *)local_698._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_698._M_string_length !=
          (undefined8 *)(local_698._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_698._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
  }
  local_698._M_dataplus._M_p._0_1_ =
       ((local_4f8 ^ (ushort)ba.mNetworkName._M_string_length) & 7) == 0;
  local_698._M_string_length = 0;
  if (!(bool)(byte)local_698._M_dataplus._M_p) {
    testing::Message::Message((Message *)&local_678);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_6b8,(internal *)&local_698,
               (AssertionResult *)
               "new_val.mAgent.mState.mConnectionMode == ba.mState.mConnectionMode","false","true",
               pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,199,local_6b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_658,(Message *)&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_658);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
      operator_delete(local_6b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_678._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_678._M_dataplus._M_p + 8))();
    }
    sVar2 = local_698._M_string_length;
    if ((undefined8 *)local_698._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_698._M_string_length !=
          (undefined8 *)(local_698._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_698._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
  }
  local_698._M_dataplus._M_p._0_1_ =
       ((local_4f8 ^ (ushort)ba.mNetworkName._M_string_length) & 0x18) == 0;
  local_698._M_string_length = 0;
  if (!(bool)(byte)local_698._M_dataplus._M_p) {
    testing::Message::Message((Message *)&local_678);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_6b8,(internal *)&local_698,
               (AssertionResult *)
               "new_val.mAgent.mState.mThreadIfStatus == ba.mState.mThreadIfStatus","false","true",
               pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,200,local_6b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_658,(Message *)&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_658);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
      operator_delete(local_6b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_678._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_678._M_dataplus._M_p + 8))();
    }
    sVar2 = local_698._M_string_length;
    if ((undefined8 *)local_698._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_698._M_string_length !=
          (undefined8 *)(local_698._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_698._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
  }
  local_698._M_dataplus._M_p._0_1_ =
       ((local_4f8 ^ (ushort)ba.mNetworkName._M_string_length) & 0x60) == 0;
  local_698._M_string_length = 0;
  if (!(bool)(byte)local_698._M_dataplus._M_p) {
    testing::Message::Message((Message *)&local_678);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_6b8,(internal *)&local_698,
               (AssertionResult *)"new_val.mAgent.mState.mAvailability == ba.mState.mAvailability",
               "false","true",pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xc9,local_6b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_658,(Message *)&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_658);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
      operator_delete(local_6b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_678._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_678._M_dataplus._M_p + 8))();
    }
    sVar2 = local_698._M_string_length;
    if ((undefined8 *)local_698._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_698._M_string_length !=
          (undefined8 *)(local_698._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_698._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
  }
  local_698._M_dataplus._M_p._0_1_ = (byte)local_230 >> 4 & 1;
  local_698._M_string_length = 0;
  if ((byte)local_698._M_dataplus._M_p == 0) {
    testing::Message::Message((Message *)&local_678);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_6b8,(internal *)&local_698,
               (AssertionResult *)
               "(new_val.mAgent.mPresentFlags & BorderAgent::kNetworkNameBit) != 0","false","true",
               pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xca,local_6b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_658,(Message *)&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_658);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
      operator_delete(local_6b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_678._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_678._M_dataplus._M_p + 8))();
    }
    sVar2 = local_698._M_string_length;
    if ((undefined8 *)local_698._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_698._M_string_length !=
          (undefined8 *)(local_698._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_698._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
  }
  if (ba.mNetworkName.field_2._8_8_ == local_4e8) {
    if (ba.mNetworkName.field_2._8_8_ != 0) {
      iVar5 = bcmp((void *)ba.mNetworkName.field_2._M_allocated_capacity,local_4f0._M_p,
                   ba.mNetworkName.field_2._8_8_);
      local_698._M_dataplus._M_p._0_1_ = iVar5 == 0;
      if (!(bool)(byte)local_698._M_dataplus._M_p) goto LAB_0015afe1;
    }
  }
  else {
    local_698._M_dataplus._M_p._0_1_ = false;
LAB_0015afe1:
    local_698._M_string_length = 0;
    testing::Message::Message((Message *)&local_678);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_6b8,(internal *)&local_698,
               (AssertionResult *)"new_val.mAgent.mNetworkName == ba.mNetworkName","false","true",
               pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xcb,local_6b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_658,(Message *)&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_658);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
      operator_delete(local_6b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_678._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_678._M_dataplus._M_p + 8))();
    }
    sVar2 = local_698._M_string_length;
    if ((undefined8 *)local_698._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_698._M_string_length !=
          (undefined8 *)(local_698._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_698._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
  }
  local_698._M_dataplus._M_p._0_1_ = (byte)local_230 >> 5 & 1;
  local_698._M_string_length = 0;
  if ((byte)local_698._M_dataplus._M_p == 0) {
    testing::Message::Message((Message *)&local_678);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_6b8,(internal *)&local_698,
               (AssertionResult *)
               "(new_val.mAgent.mPresentFlags & BorderAgent::kExtendedPanIdBit) != 0","false","true"
               ,pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xcc,local_6b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_658,(Message *)&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_658);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
      operator_delete(local_6b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_678._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_678._M_dataplus._M_p + 8))();
    }
    sVar2 = local_698._M_string_length;
    if ((undefined8 *)local_698._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_698._M_string_length !=
          (undefined8 *)(local_698._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_698._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
  }
  local_698._M_dataplus._M_p._0_1_ = ba.mVendorName._M_string_length == local_4d0;
  local_698._M_string_length = 0;
  if (!(bool)(byte)local_698._M_dataplus._M_p) {
    testing::Message::Message((Message *)&local_678);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_6b8,(internal *)&local_698,
               (AssertionResult *)"new_val.mAgent.mExtendedPanId == ba.mExtendedPanId","false",
               "true",pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xcd,local_6b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_658,(Message *)&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_658);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
      operator_delete(local_6b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_678._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_678._M_dataplus._M_p + 8))();
    }
    sVar2 = local_698._M_string_length;
    if ((undefined8 *)local_698._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_698._M_string_length !=
          (undefined8 *)(local_698._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_698._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
  }
  local_698._M_dataplus._M_p._0_1_ = (byte)local_230 >> 6 & 1;
  local_698._M_string_length = 0;
  if ((byte)local_698._M_dataplus._M_p == 0) {
    testing::Message::Message((Message *)&local_678);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_6b8,(internal *)&local_698,
               (AssertionResult *)
               "(new_val.mAgent.mPresentFlags & BorderAgent::kVendorNameBit) != 0","false","true",
               pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xce,local_6b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_658,(Message *)&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_658);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
      operator_delete(local_6b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_678._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_678._M_dataplus._M_p + 8))();
    }
    sVar2 = local_698._M_string_length;
    if ((undefined8 *)local_698._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_698._M_string_length !=
          (undefined8 *)(local_698._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_698._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
  }
  if (ba.mVendorName.field_2._8_8_ == local_4c0) {
    if (ba.mVendorName.field_2._8_8_ != 0) {
      iVar5 = bcmp((void *)ba.mVendorName.field_2._M_allocated_capacity,local_4c8._M_p,
                   ba.mVendorName.field_2._8_8_);
      local_698._M_dataplus._M_p._0_1_ = iVar5 == 0;
      if (!(bool)(byte)local_698._M_dataplus._M_p) goto LAB_0015b340;
    }
  }
  else {
    local_698._M_dataplus._M_p._0_1_ = false;
LAB_0015b340:
    local_698._M_string_length = 0;
    testing::Message::Message((Message *)&local_678);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_6b8,(internal *)&local_698,
               (AssertionResult *)"new_val.mAgent.mVendorName == ba.mVendorName","false","true",
               pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xcf,local_6b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_658,(Message *)&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_658);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
      operator_delete(local_6b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_678._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_678._M_dataplus._M_p + 8))();
    }
    sVar2 = local_698._M_string_length;
    if ((undefined8 *)local_698._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_698._M_string_length !=
          (undefined8 *)(local_698._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_698._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
  }
  local_698._M_dataplus._M_p._0_1_ = (byte)(local_230 >> 10) & 1;
  local_698._M_string_length = 0;
  if ((local_230 >> 10 & 1) == 0) {
    testing::Message::Message((Message *)&local_678);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_6b8,(internal *)&local_698,
               (AssertionResult *)
               "(new_val.mAgent.mPresentFlags & BorderAgent::kVendorDataBit) != 0","false","true",
               pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xd0,local_6b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_658,(Message *)&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_658);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
      operator_delete(local_6b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_678._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_678._M_dataplus._M_p + 8))();
    }
    sVar2 = local_698._M_string_length;
    if ((undefined8 *)local_698._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_698._M_string_length !=
          (undefined8 *)(local_698._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_698._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
  }
  if (ba.mVendorData.field_2._8_8_ == local_470) {
    if (ba.mVendorData.field_2._8_8_ == 0) goto LAB_0015b5b2;
    iVar5 = bcmp((void *)ba.mVendorData.field_2._M_allocated_capacity,local_478._M_p,
                 ba.mVendorData.field_2._8_8_);
    local_698._M_dataplus._M_p._0_1_ = iVar5 == 0;
    local_698._M_string_length = 0;
    if ((bool)(byte)local_698._M_dataplus._M_p) goto LAB_0015b5b2;
  }
  else {
    local_698._M_dataplus._M_p._0_1_ = false;
  }
  local_698._M_string_length = 0;
  testing::Message::Message((Message *)&local_678);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_6b8,(internal *)&local_698,
             (AssertionResult *)"new_val.mAgent.mVendorData == ba.mVendorData","false","true",pcVar8
            );
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_658,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
             ,0xd1,local_6b8._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_658,(Message *)&local_678);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_658);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
    operator_delete(local_6b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    (**(code **)(*(size_type *)local_678._M_dataplus._M_p + 8))();
  }
  sVar2 = local_698._M_string_length;
  if ((undefined8 *)local_698._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_698._M_string_length !=
        (undefined8 *)(local_698._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_698._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
LAB_0015b5b2:
  ba._vptr_BorderAgent = (_func_int **)&PTR__BorderRouter_002b2218;
  ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&ba.mAddr._M_string_length);
  ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&nwk);
  if (local_600._M_p != local_5f0) {
    operator_delete(local_600._M_p);
  }
  if ((undefined1 *)dom._M_string_length != (undefined1 *)((long)&dom.field_2 + 8)) {
    operator_delete((void *)dom._M_string_length);
  }
  ret_val._vptr_BorderRouter = (_func_int **)&PTR__BorderRouter_002b2218;
  ot::commissioner::BorderAgent::~BorderAgent(&ret_val.mAgent);
  ret_val._vptr_BorderRouter = (_func_int **)&ret_val.mAgent;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ret_val,"1.1.1.1","");
  local_5a8._M_dataplus._M_p = (pointer)0x0;
  local_5a8._M_string_length = 0;
  local_5a8.field_2._M_allocated_capacity = 0;
  nwk._0_8_ = &nwk.mName._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>();
  ot::commissioner::BorderAgent::State::State(&local_3d4,0);
  dom._M_dataplus._M_p = (pointer)&dom.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&dom,"net3","");
  local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b8,"vendorName","");
  local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,anon_var_dwarf_66ec33 + 9);
  local_678._M_dataplus._M_p = (pointer)&local_678.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_678,anon_var_dwarf_66ec33 + 9);
  local_588._M_dataplus._M_p = (pointer)0x0;
  local_588._M_string_length = 0;
  local_588.field_2._M_allocated_capacity = 0;
  local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_658,anon_var_dwarf_66ec33 + 9);
  local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8);
  ot::commissioner::UnixTime::UnixTime(&local_90,0);
  pcVar8 = (char *)(ulong)(uint)local_3d4;
  ot::commissioner::BorderAgent::BorderAgent
            (&ba,(string *)&ret_val,1,(ByteArray *)&local_5a8,(string *)&nwk,local_3d4,&dom,
             0x303030303030303,&local_6b8,&local_698,(Timestamp)0x0,0,&local_678,
             (ByteArray *)&local_588,&local_658,'\0',0,&local_5c8,local_90,0x73);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
    operator_delete(local_5c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658._M_dataplus._M_p != &local_658.field_2) {
    operator_delete(local_658._M_dataplus._M_p);
  }
  if (local_588._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_588._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678._M_dataplus._M_p != &local_678.field_2) {
    operator_delete(local_678._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698._M_dataplus._M_p != &local_698.field_2) {
    operator_delete(local_698._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
    operator_delete(local_6b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dom._M_dataplus._M_p != &dom.field_2) {
    operator_delete(dom._M_dataplus._M_p);
  }
  if ((size_type *)nwk._0_8_ != &nwk.mName._M_string_length) {
    operator_delete((void *)nwk._0_8_);
  }
  if (local_5a8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_5a8._M_dataplus._M_p);
  }
  if ((BorderAgent *)ret_val._vptr_BorderRouter != &ret_val.mAgent) {
    operator_delete(ret_val._vptr_BorderRouter);
  }
  SVar4 = ot::commissioner::persistent_storage::Registry::Add(&reg,&ba);
  nwk.mId.mId._0_1_ = SVar4 == kSuccess;
  nwk.mName._M_dataplus._M_p = (pointer)0x0;
  if (SVar4 != kSuccess) {
    testing::Message::Message((Message *)&dom);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ret_val,(internal *)&nwk,
               (AssertionResult *)"reg.Add(ba) == Registry::Status::kSuccess","false","true",pcVar8)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_6b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xeb,(char *)ret_val._vptr_BorderRouter);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_6b8,(Message *)&dom);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_6b8);
    if ((BorderAgent *)ret_val._vptr_BorderRouter != &ret_val.mAgent) {
      operator_delete(ret_val._vptr_BorderRouter);
    }
    if (dom._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)dom._M_dataplus._M_p + 8))();
    }
    _Var3._M_p = nwk.mName._M_dataplus._M_p;
    if (nwk.mName._M_dataplus._M_p != (pointer)0x0) {
      if (*nwk.mName._M_dataplus._M_p != nwk.mName._M_dataplus._M_p + 0x10) {
        operator_delete(*nwk.mName._M_dataplus._M_p);
      }
      operator_delete(_Var3._M_p);
    }
  }
  ot::commissioner::persistent_storage::BorderRouter::BorderRouter(&ret_val);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_3d8,0);
  SVar4 = ot::commissioner::persistent_storage::Registry::GetBorderRouter(&reg,local_3d8,&ret_val);
  dom._M_dataplus._M_p._0_1_ = SVar4 == kSuccess;
  dom._M_string_length = 0;
  if (SVar4 != kSuccess) {
    testing::Message::Message((Message *)&local_6b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&nwk,(internal *)&dom,
               (AssertionResult *)
               "reg.GetBorderRouter(BorderRouterId{0}, new_val) == Registry::Status::kSuccess",
               "false","true",pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_698,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xed,(char *)nwk._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_698,(Message *)&local_6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_698);
    if ((size_type *)nwk._0_8_ != &nwk.mName._M_string_length) {
      operator_delete((void *)nwk._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_6b8._M_dataplus._M_p + 8))();
    }
    sVar2 = dom._M_string_length;
    if (dom._M_string_length != 0) {
      if (*(void **)dom._M_string_length != (void *)(dom._M_string_length + 0x10)) {
        operator_delete(*(void **)dom._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
  }
  dom._M_dataplus._M_p._0_1_ = ret_val.mNetworkId.mId == 2;
  dom._M_string_length = 0;
  if (ret_val.mNetworkId.mId != 2) {
    testing::Message::Message((Message *)&local_6b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&nwk,(internal *)&dom,(AssertionResult *)"new_val.mNetworkId.mId == 2",
               "false","true",pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_698,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0xee,(char *)nwk._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_698,(Message *)&local_6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_698);
    if ((size_type *)nwk._0_8_ != &nwk.mName._M_string_length) {
      operator_delete((void *)nwk._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_6b8._M_dataplus._M_p + 8))();
    }
    sVar2 = dom._M_string_length;
    if (dom._M_string_length != 0) {
      if (*(void **)dom._M_string_length != (void *)(dom._M_string_length + 0x10)) {
        operator_delete(*(void **)dom._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
  }
  ret_val._vptr_BorderRouter = (_func_int **)&PTR__BorderRouter_002b2218;
  ot::commissioner::BorderAgent::~BorderAgent(&ret_val.mAgent);
  ot::commissioner::BorderAgent::~BorderAgent(&ba);
  ret_val._vptr_BorderRouter = (_func_int **)&ret_val.mAgent;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ret_val,"1.1.1.1","");
  local_5a8._M_dataplus._M_p = (pointer)0x0;
  local_5a8._M_string_length = 0;
  local_5a8.field_2._M_allocated_capacity = 0;
  nwk._0_8_ = &nwk.mName._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>();
  ot::commissioner::BorderAgent::State::State(&local_3dc,0);
  dom._M_dataplus._M_p = (pointer)&dom.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&dom,"net3","");
  local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b8,"vendorName","");
  local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,anon_var_dwarf_66ec33 + 9);
  local_678._M_dataplus._M_p = (pointer)&local_678.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_678,anon_var_dwarf_66ec33 + 9);
  local_588._M_dataplus._M_p = (pointer)0x0;
  local_588._M_string_length = 0;
  local_588.field_2._M_allocated_capacity = 0;
  local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_658,"dom2","");
  local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8);
  ot::commissioner::UnixTime::UnixTime(&local_98,0);
  pcVar8 = (char *)(ulong)(uint)local_3dc;
  ot::commissioner::BorderAgent::BorderAgent
            (&ba,(string *)&ret_val,1,(ByteArray *)&local_5a8,(string *)&nwk,local_3dc,&dom,
             0x303030303030303,&local_6b8,&local_698,(Timestamp)0x0,0,&local_678,
             (ByteArray *)&local_588,&local_658,'\0',0,&local_5c8,local_98,0x1073);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
    operator_delete(local_5c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658._M_dataplus._M_p != &local_658.field_2) {
    operator_delete(local_658._M_dataplus._M_p);
  }
  if (local_588._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_588._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678._M_dataplus._M_p != &local_678.field_2) {
    operator_delete(local_678._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698._M_dataplus._M_p != &local_698.field_2) {
    operator_delete(local_698._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
    operator_delete(local_6b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dom._M_dataplus._M_p != &dom.field_2) {
    operator_delete(dom._M_dataplus._M_p);
  }
  if ((size_type *)nwk._0_8_ != &nwk.mName._M_string_length) {
    operator_delete((void *)nwk._0_8_);
  }
  if (local_5a8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_5a8._M_dataplus._M_p);
  }
  if ((BorderAgent *)ret_val._vptr_BorderRouter != &ret_val.mAgent) {
    operator_delete(ret_val._vptr_BorderRouter);
  }
  SVar4 = ot::commissioner::persistent_storage::Registry::Add(&reg,&ba);
  nwk.mId.mId._0_1_ = SVar4 == kSuccess;
  nwk.mName._M_dataplus._M_p = (pointer)0x0;
  if (SVar4 != kSuccess) {
    testing::Message::Message((Message *)&dom);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ret_val,(internal *)&nwk,
               (AssertionResult *)"reg.Add(ba) == Registry::Status::kSuccess","false","true",pcVar8)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_6b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x108,(char *)ret_val._vptr_BorderRouter);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_6b8,(Message *)&dom);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_6b8);
    if ((BorderAgent *)ret_val._vptr_BorderRouter != &ret_val.mAgent) {
      operator_delete(ret_val._vptr_BorderRouter);
    }
    if (dom._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)dom._M_dataplus._M_p + 8))();
    }
    _Var3._M_p = nwk.mName._M_dataplus._M_p;
    if (nwk.mName._M_dataplus._M_p != (pointer)0x0) {
      if (*nwk.mName._M_dataplus._M_p != nwk.mName._M_dataplus._M_p + 0x10) {
        operator_delete(*nwk.mName._M_dataplus._M_p);
      }
      operator_delete(_Var3._M_p);
    }
  }
  ot::commissioner::persistent_storage::BorderRouter::BorderRouter(&ret_val);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_3e0,0);
  SVar4 = ot::commissioner::persistent_storage::Registry::GetBorderRouter(&reg,local_3e0,&ret_val);
  dom._M_dataplus._M_p._0_1_ = SVar4 == kSuccess;
  dom._M_string_length = 0;
  if (SVar4 != kSuccess) {
    testing::Message::Message((Message *)&local_6b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&nwk,(internal *)&dom,
               (AssertionResult *)
               "reg.GetBorderRouter(BorderRouterId{0}, new_val) == Registry::Status::kSuccess",
               "false","true",pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_698,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x10a,(char *)nwk._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_698,(Message *)&local_6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_698);
    if ((size_type *)nwk._0_8_ != &nwk.mName._M_string_length) {
      operator_delete((void *)nwk._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_6b8._M_dataplus._M_p + 8))();
    }
    sVar2 = dom._M_string_length;
    if (dom._M_string_length != 0) {
      if (*(void **)dom._M_string_length != (void *)(dom._M_string_length + 0x10)) {
        operator_delete(*(void **)dom._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
  }
  dom._M_dataplus._M_p._0_1_ = ret_val.mNetworkId.mId == 2;
  dom._M_string_length = 0;
  if (ret_val.mNetworkId.mId != 2) {
    testing::Message::Message((Message *)&local_6b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&nwk,(internal *)&dom,(AssertionResult *)"new_val.mNetworkId.mId == 2",
               "false","true",pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_698,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x10b,(char *)nwk._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_698,(Message *)&local_6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_698);
    if ((size_type *)nwk._0_8_ != &nwk.mName._M_string_length) {
      operator_delete((void *)nwk._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_6b8._M_dataplus._M_p + 8))();
    }
    sVar2 = dom._M_string_length;
    if (dom._M_string_length != 0) {
      if (*(void **)dom._M_string_length != (void *)(dom._M_string_length + 0x10)) {
        operator_delete(*(void **)dom._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
  }
  ot::commissioner::persistent_storage::Network::Network(&nwk);
  SVar4 = ot::commissioner::persistent_storage::Registry::GetNetworkByName
                    (&reg,&ba.mNetworkName,&nwk);
  local_6b8._M_string_length = 0;
  if (SVar4 != kSuccess) {
    local_6b8._M_dataplus._M_p._0_1_ = SVar4 == kSuccess;
    testing::Message::Message((Message *)&local_698);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&dom,(internal *)&local_6b8,
               (AssertionResult *)
               "reg.GetNetworkByName(ba.mNetworkName, nwk) == Registry::Status::kSuccess","false",
               "true",pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_678,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x10d,dom._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_678,(Message *)&local_698);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_678);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dom._M_dataplus._M_p != &dom.field_2) {
      operator_delete(dom._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_698._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_698._M_dataplus._M_p + 8))();
    }
    sVar2 = local_6b8._M_string_length;
    if ((undefined8 *)local_6b8._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_6b8._M_string_length !=
          (undefined8 *)(local_6b8._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_6b8._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
  }
  local_6b8._M_dataplus._M_p._0_1_ = nwk.mDomainId.mId == 0;
  local_6b8._M_string_length = 0;
  if (nwk.mDomainId.mId != 0) {
    testing::Message::Message((Message *)&local_698);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&dom,(internal *)&local_6b8,(AssertionResult *)"nwk.mDomainId.mId == 0","false",
               "true",pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_678,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x10e,dom._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_678,(Message *)&local_698);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_678);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dom._M_dataplus._M_p != &dom.field_2) {
      operator_delete(dom._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_698._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_698._M_dataplus._M_p + 8))();
    }
    sVar2 = local_6b8._M_string_length;
    if ((undefined8 *)local_6b8._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_6b8._M_string_length !=
          (undefined8 *)(local_6b8._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_6b8._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)nwk.mMlp._M_dataplus._M_p != &nwk.mMlp.field_2) {
    operator_delete(nwk.mMlp._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)nwk.mName._M_dataplus._M_p != &nwk.mName.field_2) {
    operator_delete(nwk.mName._M_dataplus._M_p);
  }
  ret_val._vptr_BorderRouter = (_func_int **)&PTR__BorderRouter_002b2218;
  ot::commissioner::BorderAgent::~BorderAgent(&ret_val.mAgent);
  ot::commissioner::BorderAgent::~BorderAgent(&ba);
  ret_val._vptr_BorderRouter = (_func_int **)&ret_val.mAgent;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ret_val,"1.1.1.1","");
  local_5a8._M_dataplus._M_p = (pointer)0x0;
  local_5a8._M_string_length = 0;
  local_5a8.field_2._M_allocated_capacity = 0;
  nwk._0_8_ = &nwk.mName._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>();
  ot::commissioner::BorderAgent::State::State(&local_3e4,0);
  dom._M_dataplus._M_p = (pointer)&dom.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&dom,"net3","");
  local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b8,"vendorName","");
  local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,anon_var_dwarf_66ec33 + 9);
  local_678._M_dataplus._M_p = (pointer)&local_678.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_678,anon_var_dwarf_66ec33 + 9);
  local_588._M_dataplus._M_p = (pointer)0x0;
  local_588._M_string_length = 0;
  local_588.field_2._M_allocated_capacity = 0;
  local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_658,"dom1","");
  local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8);
  ot::commissioner::UnixTime::UnixTime(&local_a0,0);
  pcVar8 = (char *)(ulong)(uint)local_3e4;
  ot::commissioner::BorderAgent::BorderAgent
            (&ba,(string *)&ret_val,1,(ByteArray *)&local_5a8,(string *)&nwk,local_3e4,&dom,
             0x303030303030303,&local_6b8,&local_698,(Timestamp)0x0,0,&local_678,
             (ByteArray *)&local_588,&local_658,'\0',0,&local_5c8,local_a0,0x1073);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
    operator_delete(local_5c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658._M_dataplus._M_p != &local_658.field_2) {
    operator_delete(local_658._M_dataplus._M_p);
  }
  if (local_588._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_588._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678._M_dataplus._M_p != &local_678.field_2) {
    operator_delete(local_678._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698._M_dataplus._M_p != &local_698.field_2) {
    operator_delete(local_698._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
    operator_delete(local_6b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dom._M_dataplus._M_p != &dom.field_2) {
    operator_delete(dom._M_dataplus._M_p);
  }
  if ((size_type *)nwk._0_8_ != &nwk.mName._M_string_length) {
    operator_delete((void *)nwk._0_8_);
  }
  if (local_5a8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_5a8._M_dataplus._M_p);
  }
  if ((BorderAgent *)ret_val._vptr_BorderRouter != &ret_val.mAgent) {
    operator_delete(ret_val._vptr_BorderRouter);
  }
  SVar4 = ot::commissioner::persistent_storage::Registry::Add(&reg,&ba);
  nwk.mId.mId._0_1_ = SVar4 == kSuccess;
  nwk.mName._M_dataplus._M_p = (pointer)0x0;
  if (SVar4 != kSuccess) {
    testing::Message::Message((Message *)&dom);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ret_val,(internal *)&nwk,
               (AssertionResult *)"reg.Add(ba) == Registry::Status::kSuccess","false","true",pcVar8)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_6b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x128,(char *)ret_val._vptr_BorderRouter);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_6b8,(Message *)&dom);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_6b8);
    if ((BorderAgent *)ret_val._vptr_BorderRouter != &ret_val.mAgent) {
      operator_delete(ret_val._vptr_BorderRouter);
    }
    if (dom._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)dom._M_dataplus._M_p + 8))();
    }
    _Var3._M_p = nwk.mName._M_dataplus._M_p;
    if (nwk.mName._M_dataplus._M_p != (pointer)0x0) {
      if (*nwk.mName._M_dataplus._M_p != nwk.mName._M_dataplus._M_p + 0x10) {
        operator_delete(*nwk.mName._M_dataplus._M_p);
      }
      operator_delete(_Var3._M_p);
    }
  }
  ot::commissioner::persistent_storage::BorderRouter::BorderRouter(&ret_val);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_3e8,0);
  SVar4 = ot::commissioner::persistent_storage::Registry::GetBorderRouter(&reg,local_3e8,&ret_val);
  dom._M_dataplus._M_p._0_1_ = SVar4 == kSuccess;
  dom._M_string_length = 0;
  if (SVar4 != kSuccess) {
    testing::Message::Message((Message *)&local_6b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&nwk,(internal *)&dom,
               (AssertionResult *)
               "reg.GetBorderRouter(BorderRouterId{0}, new_val) == Registry::Status::kSuccess",
               "false","true",pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_698,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x12a,(char *)nwk._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_698,(Message *)&local_6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_698);
    if ((size_type *)nwk._0_8_ != &nwk.mName._M_string_length) {
      operator_delete((void *)nwk._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_6b8._M_dataplus._M_p + 8))();
    }
    sVar2 = dom._M_string_length;
    if (dom._M_string_length != 0) {
      if (*(void **)dom._M_string_length != (void *)(dom._M_string_length + 0x10)) {
        operator_delete(*(void **)dom._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
  }
  dom._M_dataplus._M_p._0_1_ = ret_val.mNetworkId.mId == 2;
  dom._M_string_length = 0;
  if (ret_val.mNetworkId.mId != 2) {
    testing::Message::Message((Message *)&local_6b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&nwk,(internal *)&dom,(AssertionResult *)"new_val.mNetworkId.mId == 2",
               "false","true",pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_698,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,299,(char *)nwk._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_698,(Message *)&local_6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_698);
    if ((size_type *)nwk._0_8_ != &nwk.mName._M_string_length) {
      operator_delete((void *)nwk._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_6b8._M_dataplus._M_p + 8))();
    }
    sVar2 = dom._M_string_length;
    if (dom._M_string_length != 0) {
      if (*(void **)dom._M_string_length != (void *)(dom._M_string_length + 0x10)) {
        operator_delete(*(void **)dom._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
  }
  ot::commissioner::persistent_storage::Network::Network(&nwk);
  SVar4 = ot::commissioner::persistent_storage::Registry::GetNetworkByName
                    (&reg,&ba.mNetworkName,&nwk);
  local_6b8._M_string_length = 0;
  if (SVar4 != kSuccess) {
    local_6b8._M_dataplus._M_p._0_1_ = SVar4 == kSuccess;
    testing::Message::Message((Message *)&local_698);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&dom,(internal *)&local_6b8,
               (AssertionResult *)
               "reg.GetNetworkByName(ba.mNetworkName, nwk) == Registry::Status::kSuccess","false",
               "true",pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_678,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x12d,dom._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_678,(Message *)&local_698);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_678);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dom._M_dataplus._M_p != &dom.field_2) {
      operator_delete(dom._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_698._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_698._M_dataplus._M_p + 8))();
    }
    sVar2 = local_6b8._M_string_length;
    if ((undefined8 *)local_6b8._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_6b8._M_string_length !=
          (undefined8 *)(local_6b8._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_6b8._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
  }
  local_6b8._M_dataplus._M_p._0_1_ = nwk.mDomainId.mId == 1;
  local_6b8._M_string_length = 0;
  if (nwk.mDomainId.mId != 1) {
    testing::Message::Message((Message *)&local_698);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&dom,(internal *)&local_6b8,(AssertionResult *)"nwk.mDomainId.mId == 1","false",
               "true",pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_678,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x12e,dom._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_678,(Message *)&local_698);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_678);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dom._M_dataplus._M_p != &dom.field_2) {
      operator_delete(dom._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_698._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_698._M_dataplus._M_p + 8))();
    }
    sVar2 = local_6b8._M_string_length;
    if ((undefined8 *)local_6b8._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_6b8._M_string_length !=
          (undefined8 *)(local_6b8._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_6b8._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)nwk.mMlp._M_dataplus._M_p != &nwk.mMlp.field_2) {
    operator_delete(nwk.mMlp._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)nwk.mName._M_dataplus._M_p != &nwk.mName.field_2) {
    operator_delete(nwk.mName._M_dataplus._M_p);
  }
  ret_val._vptr_BorderRouter = (_func_int **)&PTR__BorderRouter_002b2218;
  ot::commissioner::BorderAgent::~BorderAgent(&ret_val.mAgent);
  ot::commissioner::BorderAgent::~BorderAgent(&ba);
  SVar4 = ot::commissioner::persistent_storage::Registry::Close(&reg);
  ba._vptr_BorderAgent = (_func_int **)CONCAT71(ba._vptr_BorderAgent._1_7_,SVar4 == kSuccess);
  ba.mAddr._M_dataplus._M_p = (pointer)0x0;
  if (SVar4 != kSuccess) {
    testing::Message::Message((Message *)&nwk);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ret_val,(internal *)&ba,
               (AssertionResult *)"reg.Close() == Registry::Status::kSuccess","false","true",pcVar8)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&dom,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry_test.cpp"
               ,0x131,(char *)ret_val._vptr_BorderRouter);
    testing::internal::AssertHelper::operator=((AssertHelper *)&dom,(Message *)&nwk);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&dom);
    if ((BorderAgent *)ret_val._vptr_BorderRouter != &ret_val.mAgent) {
      operator_delete(ret_val._vptr_BorderRouter);
    }
    if (nwk._0_8_ != 0) {
      (**(code **)(*(long *)nwk._0_8_ + 8))();
    }
    _Var3._M_p = ba.mAddr._M_dataplus._M_p;
    if (ba.mAddr._M_dataplus._M_p != (pointer)0x0) {
      if (*ba.mAddr._M_dataplus._M_p != ba.mAddr._M_dataplus._M_p + 0x10) {
        operator_delete(*ba.mAddr._M_dataplus._M_p);
      }
      operator_delete(_Var3._M_p);
    }
  }
  ot::commissioner::persistent_storage::Registry::~Registry(&reg);
  return;
}

Assistant:

TEST(RegJson, CreateBorderRouterFromBorderAgent)
{
    unlink(json_path);
    Registry reg(json_path);

    EXPECT_TRUE(reg.Open() == Registry::Status::kSuccess);

    // Create BorderRouter with network
    {
        BorderAgent ba{"1.1.1.1",
                       1,
                       ByteArray{},
                       "",
                       BorderAgent::State{0},
                       "net1",
                       0x0101010101010101,
                       "",
                       "",
                       Timestamp{},
                       0,
                       "",
                       ByteArray{},
                       "",
                       0,
                       0,
                       "",
                       0,
                       BorderAgent::kAddrBit | BorderAgent::kPortBit | BorderAgent::kNetworkNameBit |
                           BorderAgent::kExtendedPanIdBit};
        EXPECT_TRUE(reg.Add(ba) == Registry::Status::kSuccess);
        BorderRouter ret_val;
        EXPECT_TRUE(reg.GetBorderRouter(BorderRouterId{0}, ret_val) == Registry::Status::kSuccess);
        EXPECT_TRUE(ret_val.mNetworkId.mId == 0);
        Network nwk;
        EXPECT_TRUE(reg.GetNetworkByXpan(0, nwk) == Registry::Status::kSuccess);
        EXPECT_TRUE(nwk.mDomainId.mId == EMPTY_ID);
    }

    // Create BorderRouter with network and domain
    {
        BorderAgent ba{"1.1.1.2",
                       2,
                       ByteArray{},
                       "",
                       BorderAgent::State{0},
                       "net2",
                       0x0202020202020202,
                       "",
                       "",
                       Timestamp{},
                       0,
                       "",
                       ByteArray{},
                       "dom2",
                       0,
                       0,
                       "",
                       0,
                       BorderAgent::kAddrBit | BorderAgent::kPortBit | BorderAgent::kNetworkNameBit |
                           BorderAgent::kExtendedPanIdBit | BorderAgent::kDomainNameBit};
        EXPECT_TRUE(reg.Add(ba) == Registry::Status::kSuccess);

        BorderRouter ret_val;
        EXPECT_TRUE(reg.GetBorderRouter(BorderRouterId{1}, ret_val) == Registry::Status::kSuccess);
        EXPECT_TRUE(ret_val.mNetworkId.mId == 1);
        Network nwk;
        EXPECT_TRUE(reg.GetNetworkByName(ba.mNetworkName, nwk) == Registry::Status::kSuccess);
        EXPECT_TRUE(nwk.mId.mId == 1);
        EXPECT_TRUE(nwk.mDomainId.mId == 0);
        std::string dom;
        EXPECT_TRUE(reg.GetDomainNameByXpan(nwk.mXpan, dom) == Registry::Status::kSuccess);
        EXPECT_TRUE(dom == ba.mDomainName);
    }

    // Fail to create BorderRouter without network
    {
        // Modify explicitly
        BorderAgent ba{"1.1.1.1",
                       1,
                       ByteArray{},
                       "",
                       BorderAgent::State{0},
                       "",
                       0,
                       "vendorName",
                       "",
                       Timestamp{},
                       0,
                       "",
                       ByteArray{},
                       "",
                       0,
                       0,
                       "",
                       0,
                       BorderAgent::kAddrBit | BorderAgent::kPortBit | BorderAgent::kVendorNameBit};
        EXPECT_TRUE(reg.Add(ba) == Registry::Status::kError);
    }
    // Update BorderRouter fields
    {
        // Check the BorderRouter present
        BorderRouter val;
        EXPECT_TRUE(reg.GetBorderRouter(BorderRouterId{0}, val) == Registry::Status::kSuccess);
        EXPECT_TRUE((val.mAgent.mPresentFlags & (BorderAgent::kAddrBit | BorderAgent::kPortBit)) ==
                    (BorderAgent::kAddrBit | BorderAgent::kPortBit));
        EXPECT_TRUE(val.mAgent.mAddr == "1.1.1.1");
        INFO(val.mAgent.mNetworkName + " : " + utils::Hex(val.mAgent.mExtendedPanId));
        Network nwk;
        EXPECT_TRUE(reg.GetNetworkByXpan(val.mAgent.mExtendedPanId, nwk) == Registry::Status::kSuccess);
        // Modify explicitly
        BorderAgent ba{"1.1.1.1",
                       1,
                       ByteArray{},
                       "",
                       BorderAgent::State{BorderAgent::State::ConnectionMode::kVendorSpecific,
                                          BorderAgent::State::ThreadInterfaceStatus::kActive,
                                          BorderAgent::State::Availability::kHigh, 0, 0},
                       "net1",
                       0x0101010101010101,
                       "vendorName",
                       "",
                       Timestamp{},
                       0,
                       "vendorData",
                       ByteArray{},
                       "",
                       0,
                       0,
                       "",
                       0,
                       BorderAgent::kAddrBit | BorderAgent::kPortBit | BorderAgent::kStateBit |
                           BorderAgent::kNetworkNameBit | BorderAgent::kExtendedPanIdBit | BorderAgent::kVendorNameBit |
                           BorderAgent::kVendorDataBit};
        EXPECT_TRUE(reg.Add(ba) == Registry::Status::kSuccess);
        BorderRouter new_val;
        EXPECT_TRUE(reg.GetBorderRouter(BorderRouterId{0}, new_val) == Registry::Status::kSuccess);
        EXPECT_TRUE(val.mId.mId == new_val.mId.mId);
        EXPECT_TRUE(val.mNetworkId.mId == new_val.mNetworkId.mId);
        EXPECT_TRUE((new_val.mAgent.mPresentFlags & BorderAgent::kStateBit) != 0);
        EXPECT_TRUE(new_val.mAgent.mState.mConnectionMode == ba.mState.mConnectionMode);
        EXPECT_TRUE(new_val.mAgent.mState.mThreadIfStatus == ba.mState.mThreadIfStatus);
        EXPECT_TRUE(new_val.mAgent.mState.mAvailability == ba.mState.mAvailability);
        EXPECT_TRUE((new_val.mAgent.mPresentFlags & BorderAgent::kNetworkNameBit) != 0);
        EXPECT_TRUE(new_val.mAgent.mNetworkName == ba.mNetworkName);
        EXPECT_TRUE((new_val.mAgent.mPresentFlags & BorderAgent::kExtendedPanIdBit) != 0);
        EXPECT_TRUE(new_val.mAgent.mExtendedPanId == ba.mExtendedPanId);
        EXPECT_TRUE((new_val.mAgent.mPresentFlags & BorderAgent::kVendorNameBit) != 0);
        EXPECT_TRUE(new_val.mAgent.mVendorName == ba.mVendorName);
        EXPECT_TRUE((new_val.mAgent.mPresentFlags & BorderAgent::kVendorDataBit) != 0);
        EXPECT_TRUE(new_val.mAgent.mVendorData == ba.mVendorData);
    }

    // Update BorderRouter - switch network
    {
        // Modify explicitly
        BorderAgent ba{"1.1.1.1",
                       1,
                       ByteArray{},
                       "",
                       BorderAgent::State{0},
                       "net3",
                       0x0303030303030303,
                       "vendorName",
                       "",
                       Timestamp{},
                       0,
                       "",
                       ByteArray{},
                       "",
                       0,
                       0,
                       "",
                       0,
                       BorderAgent::kAddrBit | BorderAgent::kPortBit | BorderAgent::kNetworkNameBit |
                           BorderAgent::kExtendedPanIdBit | BorderAgent::kVendorNameBit};
        EXPECT_TRUE(reg.Add(ba) == Registry::Status::kSuccess);
        BorderRouter new_val;
        EXPECT_TRUE(reg.GetBorderRouter(BorderRouterId{0}, new_val) == Registry::Status::kSuccess);
        EXPECT_TRUE(new_val.mNetworkId.mId == 2);
    }

    // Update BorderRouter - add network into domain
    {
        // Modify explicitly
        BorderAgent ba{"1.1.1.1",
                       1,
                       ByteArray{},
                       "",
                       BorderAgent::State{0},
                       "net3",
                       0x0303030303030303,
                       "vendorName",
                       "",
                       Timestamp{},
                       0,
                       "",
                       ByteArray{},
                       "dom2",
                       0,
                       0,
                       "",
                       0,
                       BorderAgent::kAddrBit | BorderAgent::kPortBit | BorderAgent::kNetworkNameBit |
                           BorderAgent::kExtendedPanIdBit | BorderAgent::kVendorNameBit | BorderAgent::kDomainNameBit};
        EXPECT_TRUE(reg.Add(ba) == Registry::Status::kSuccess);
        BorderRouter new_val;
        EXPECT_TRUE(reg.GetBorderRouter(BorderRouterId{0}, new_val) == Registry::Status::kSuccess);
        EXPECT_TRUE(new_val.mNetworkId.mId == 2);
        Network nwk;
        EXPECT_TRUE(reg.GetNetworkByName(ba.mNetworkName, nwk) == Registry::Status::kSuccess);
        EXPECT_TRUE(nwk.mDomainId.mId == 0);
    }

    // Update BorderRouter - move network into another domain
    {
        // Modify explicitly
        BorderAgent ba{"1.1.1.1",
                       1,
                       ByteArray{},
                       "",
                       BorderAgent::State{0},
                       "net3",
                       0x0303030303030303,
                       "vendorName",
                       "",
                       Timestamp{},
                       0,
                       "",
                       ByteArray{},
                       "dom1", // New domain, will have id == 1
                       0,
                       0,
                       "",
                       0,
                       BorderAgent::kAddrBit | BorderAgent::kPortBit | BorderAgent::kNetworkNameBit |
                           BorderAgent::kExtendedPanIdBit | BorderAgent::kVendorNameBit | BorderAgent::kDomainNameBit};
        EXPECT_TRUE(reg.Add(ba) == Registry::Status::kSuccess);
        BorderRouter new_val;
        EXPECT_TRUE(reg.GetBorderRouter(BorderRouterId{0}, new_val) == Registry::Status::kSuccess);
        EXPECT_TRUE(new_val.mNetworkId.mId == 2);
        Network nwk;
        EXPECT_TRUE(reg.GetNetworkByName(ba.mNetworkName, nwk) == Registry::Status::kSuccess);
        EXPECT_TRUE(nwk.mDomainId.mId == 1);
    }

    EXPECT_TRUE(reg.Close() == Registry::Status::kSuccess);
}